

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_single.hpp
# Opt level: O3

void __thiscall Infector::Container::bindSingleAsNothing<GoodClassVS>(Container *this)

{
  mapped_type *pmVar1;
  iterator iVar2;
  mapped_type pIVar3;
  mapped_type *ppIVar4;
  key_type local_28;
  
  must_not_have<GoodClassVS>(this);
  local_28._M_target = (type_info *)&GoodClassVS::typeinfo;
  pmVar1 = std::__detail::
           _Map_base<std::type_index,_std::pair<const_std::type_index,_Infector::Container::Binding>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_Infector::Container::Binding>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->typeMap,&local_28);
  (pmVar1->type)._M_target = (type_info *)&GoodClassVS::typeinfo;
  pmVar1->single = true;
  local_28._M_target = (type_info *)&GoodClassVS::typeinfo;
  iVar2 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_Infector::IAnyShared_*>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_Infector::IAnyShared_*>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_28);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    pIVar3 = (mapped_type)operator_new(0x58);
    pIVar3->_vptr_IAnyShared = (_func_int **)0x0;
    pIVar3[1]._vptr_IAnyShared = (_func_int **)0x0;
    pIVar3[4]._vptr_IAnyShared = (_func_int **)0x0;
    pIVar3[5]._vptr_IAnyShared = (_func_int **)0x0;
    pIVar3[8]._vptr_IAnyShared = (_func_int **)0x0;
    pIVar3[9]._vptr_IAnyShared = (_func_int **)0x0;
    pIVar3[6]._vptr_IAnyShared = (_func_int **)0x0;
    pIVar3[7]._vptr_IAnyShared = (_func_int **)0x0;
    pIVar3[2]._vptr_IAnyShared = (_func_int **)0x0;
    pIVar3[3]._vptr_IAnyShared = (_func_int **)0x0;
    pIVar3->_vptr_IAnyShared = (_func_int **)&PTR_getPtr_001824c8;
    *(undefined4 *)&pIVar3[1]._vptr_IAnyShared = 0xc0de;
    pIVar3[4]._vptr_IAnyShared = (_func_int **)(pIVar3 + 10);
    pIVar3[5]._vptr_IAnyShared = (_func_int **)0x1;
    *(undefined4 *)&pIVar3[8]._vptr_IAnyShared = 0x3f800000;
    pIVar3[9]._vptr_IAnyShared = (_func_int **)0x0;
    pIVar3[10]._vptr_IAnyShared = (_func_int **)0x0;
    local_28._M_target = (type_info *)&GoodClassVS::typeinfo;
    ppIVar4 = std::__detail::
              _Map_base<std::type_index,_std::pair<const_std::type_index,_Infector::IAnyShared_*>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_Infector::IAnyShared_*>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this,&local_28);
    *ppIVar4 = pIVar3;
  }
  return;
}

Assistant:

void Container::bindSingleAsNothing(){
        bool tests = reduced_type_tests<T>();
        (void) tests; //fix unused variable warning
        must_not_have<T>();

        typeMap[std::type_index(typeid(T))]
                = Binding(std::type_index(typeid(T)), true);

        try{
            if(singleIstances.find( std::type_index(typeid(T)) )
                                    ==singleIstances.end())
                singleIstances[std::type_index(typeid(T))]
                                = new AnyShared<T>();
        }catch(std::exception & ex){
            auto it2 = typeMap.find( std::type_index(typeid(T)) );
            typeMap.erase(it2);
            throw ex;
        }catch(...){
            auto it2 = typeMap.find( std::type_index(typeid(T)) );
            typeMap.erase(it2);
            launch_exception<ExUnkownException>();
        }
    }